

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

mkv_timestamp_t MATROSKA_BlockTimestamp(matroska_block *Block)

{
  short sVar1;
  bool_t bVar2;
  ebml_context *Context;
  mkv_timestamp_t mVar3;
  mkv_timestamp_t mVar4;
  long lVar5;
  matroska_block *Cluster;
  double dVar6;
  
  bVar2 = Node_IsPartOf(Block,0x4c424b4d);
  if (bVar2 == 0) {
    __assert_fail("Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x2a5,"mkv_timestamp_t MATROSKA_BlockTimestamp(matroska_block *)");
  }
  lVar5 = Block->GlobalTimestamp;
  if (lVar5 == 0x7fffffffffffffff) {
    if (Block->ReadTrack == (ebml_master *)0x0) {
LAB_00107711:
      lVar5 = 0x7fffffffffffffff;
    }
    else {
      Cluster = Block;
      if (Block->LocalTimestampUsed == 0) {
        __assert_fail("Block->LocalTimestampUsed",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x2aa,"mkv_timestamp_t MATROSKA_BlockTimestamp(matroska_block *)");
      }
      do {
        Cluster = (matroska_block *)(Cluster->Base).Base.Base.Parent;
        if (Cluster == (matroska_block *)0x0) goto LAB_00107711;
        Context = MATROSKA_getContextCluster();
        bVar2 = EBML_ElementIsType((ebml_element *)Cluster,Context);
      } while (bVar2 == 0);
      mVar3 = MATROSKA_ClusterTimestamp((matroska_cluster *)Cluster);
      sVar1 = Block->LocalTimestamp;
      mVar4 = MATROSKA_SegmentInfoTimestampScale(Block->ReadSegInfo);
      dVar6 = MATROSKA_TrackTimestampScale(Block->ReadTrack);
      lVar5 = (long)(dVar6 * (double)(mVar4 * sVar1)) + mVar3;
      Block->GlobalTimestamp = lVar5;
      mVar3 = MATROSKA_ClusterTimestamp((matroska_cluster *)Cluster);
      MATROSKA_BlockSetTimestamp(Block,lVar5,mVar3);
      lVar5 = Block->GlobalTimestamp;
    }
  }
  return lVar5;
}

Assistant:

mkv_timestamp_t MATROSKA_BlockTimestamp(matroska_block *Block)
{
    ebml_element *Cluster;
    assert(Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS));
    if (Block->GlobalTimestamp!=INVALID_TIMESTAMP_T)
        return Block->GlobalTimestamp;
    if (Block->ReadTrack==NULL)
        return INVALID_TIMESTAMP_T;
    assert(Block->LocalTimestampUsed);
    Cluster = EBML_ElementParent(Block);
    while (Cluster && !EBML_ElementIsType(Cluster, MATROSKA_getContextCluster()))
        Cluster = EBML_ElementParent(Cluster);
    if (!Cluster)
        return INVALID_TIMESTAMP_T;
    Block->GlobalTimestamp = MATROSKA_ClusterTimestamp((matroska_cluster*)Cluster) + (mkv_timestamp_t)(Block->LocalTimestamp * MATROSKA_SegmentInfoTimestampScale(Block->ReadSegInfo) * MATROSKA_TrackTimestampScale(Block->ReadTrack));
    MATROSKA_BlockSetTimestamp(Block, Block->GlobalTimestamp, MATROSKA_ClusterTimestamp((matroska_cluster*)Cluster));
    return Block->GlobalTimestamp;
}